

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VSS.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::VSSMethod::doRNEMDImpl
          (VSSMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  RealType RVar7;
  RealType RVar8;
  bool bVar9;
  double *pdVar10;
  long in_RDI;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector3d angMom_3;
  Vector3d angMom_2;
  Vector3d rPos_2;
  Vector3d vel_2;
  iterator sdi;
  RealType h;
  RealType hDenominator;
  RealType hNumerator;
  Vector3d omegah;
  Mat3x3d Ihi;
  Vector3d vh;
  RealType c;
  RealType cDenominator;
  RealType cNumerator;
  Vector3d omegac;
  Mat3x3d Ici;
  Vector3d vc;
  bool successfulExchange;
  Vector3d bhrec;
  Vector3d bh;
  Vector3d ahrec;
  Vector3d ah;
  Vector3d bcrec;
  Vector3d bc;
  Vector3d acrec;
  Vector3d ac;
  int k_1;
  int j_1;
  int i_1;
  Mat3x3d I_1;
  Vector3d angMom_1;
  RealType r2_1;
  Vector3d rPos_1;
  Vector3d vel_1;
  RealType mass_1;
  Vector3d pos_1;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  RealType r2;
  Vector3d rPos;
  Vector3d vel;
  RealType mass;
  Vector3d pos;
  bool doAngularPart;
  bool doLinearPart;
  RealType Kc;
  Mat3x3d Ic;
  RealType Mc;
  Vector3d Lc;
  Vector3d Pc;
  RealType Kh;
  Mat3x3d Ih;
  RealType Mh;
  Vector3d Lh;
  Vector3d Ph;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> coldBin;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> hotBin;
  StuntDouble *sd;
  int selej;
  int selei;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff058;
  errorStruct *peVar14;
  undefined6 in_stack_fffffffffffff060;
  undefined1 in_stack_fffffffffffff066;
  undefined1 in_stack_fffffffffffff067;
  StuntDouble *in_stack_fffffffffffff068;
  SelectionManager *in_stack_fffffffffffff070;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff078;
  Vector<double,_3U> *in_stack_fffffffffffff080;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff088;
  Vector3<double> *in_stack_fffffffffffff0c0;
  StuntDouble *in_stack_fffffffffffff0c8;
  Vector3d *in_stack_fffffffffffff0d8;
  Snapshot *in_stack_fffffffffffff0e0;
  SquareMatrix3<double> *in_stack_fffffffffffff0f8;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_938;
  double local_930;
  double local_910;
  double local_8f0;
  double local_7b0;
  double local_790;
  double local_770;
  byte local_5e1;
  uint local_51c;
  uint local_518;
  int local_514;
  RectMatrix<double,_3U,_3U> local_510;
  Vector<double,_3U> local_4c8 [4];
  RectMatrix<double,_3U,_3U> local_468 [2];
  double local_3d8;
  RealType local_370;
  uint local_34c;
  uint local_348;
  int local_344;
  RectMatrix<double,_3U,_3U> local_340;
  Vector<double,_3U> local_2f8 [4];
  RectMatrix<double,_3U,_3U> local_298 [2];
  double local_208;
  RealType local_1a0;
  bool local_17a;
  bool local_179;
  double local_178;
  RectMatrix<double,_3U,_3U> local_170;
  double local_128;
  double local_f0;
  RectMatrix<double,_3U,_3U> local_e8;
  double local_a0;
  StuntDouble *local_28;
  
  if ((*(byte *)(in_RDI + 0x288) & 1) == 0) {
    return;
  }
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x360aea);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x360af7);
  Vector3<double>::Vector3
            ((Vector3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (Vector3<double> *)in_stack_fffffffffffff058);
  Vector3<double>::Vector3
            ((Vector3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (Vector3<double> *)in_stack_fffffffffffff058);
  local_a0 = 0.0;
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (double)in_stack_fffffffffffff058);
  local_f0 = 0.0;
  Vector3<double>::Vector3
            ((Vector3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (Vector3<double> *)in_stack_fffffffffffff058);
  Vector3<double>::Vector3
            ((Vector3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (Vector3<double> *)in_stack_fffffffffffff058);
  local_128 = 0.0;
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)
             CONCAT17(in_stack_fffffffffffff067,
                      CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
             (double)in_stack_fffffffffffff058);
  local_178 = 0.0;
  local_179 = false;
  local_17a = false;
  uVar6 = *(uint *)(in_RDI + 0x244);
  if (uVar6 < 3) {
LAB_00360c5f:
    local_17a = (*(byte *)(in_RDI + 0x289) & 1) == 0;
    local_179 = !local_17a;
    goto LAB_00360c84;
  }
  if (uVar6 - 3 < 4) {
LAB_00360c49:
    local_179 = true;
  }
  else {
    if (3 < uVar6 - 7) {
      if (uVar6 - 0xe < 3) goto LAB_00360c49;
      if (3 < uVar6 - 0x11) goto LAB_00360c5f;
    }
    local_17a = true;
  }
LAB_00360c84:
  local_28 = SelectionManager::beginSelected
                       (in_stack_fffffffffffff070,(int *)in_stack_fffffffffffff068);
  while (local_28 != (StuntDouble *)0x0) {
    StuntDouble::getPos(in_stack_fffffffffffff068);
    if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
      Snapshot::wrapVector(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    }
    local_1a0 = StuntDouble::getMass(local_28);
    StuntDouble::getVel(in_stack_fffffffffffff068);
    StuntDouble::getPos(in_stack_fffffffffffff068);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::Vector3
              ((Vector3<double> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
              ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
               in_stack_fffffffffffff070,(value_type *)in_stack_fffffffffffff068);
    OpenMD::operator*((double)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    RVar7 = local_1a0;
    local_a0 = local_a0 + local_1a0;
    dVar11 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x360e41);
    local_f0 = RVar7 * dVar11 + local_f0;
    cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
    OpenMD::operator*((double)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    outProduct<double>((Vector3<double> *)in_stack_fffffffffffff088,
                       (Vector3<double> *)in_stack_fffffffffffff080);
    OpenMD::operator*(in_stack_fffffffffffff078,(double)in_stack_fffffffffffff070);
    RectMatrix<double,_3U,_3U>::operator-=
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               in_stack_fffffffffffff058);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_298);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x360f4b);
    dVar12 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x360f58);
    RVar7 = local_1a0;
    local_208 = dVar12;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_e8,0,0);
    RVar8 = local_1a0;
    dVar11 = local_208;
    *pdVar10 = RVar7 * dVar12 + *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_e8,1,1);
    RVar7 = local_1a0;
    dVar12 = local_208;
    *pdVar10 = RVar8 * dVar11 + *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_e8,2,2);
    *pdVar10 = RVar7 * dVar12 + *pdVar10;
    if ((*(int *)(in_RDI + 0x244) == 2) &&
       (bVar9 = StuntDouble::isDirectional
                          ((StuntDouble *)
                           CONCAT17(in_stack_fffffffffffff067,
                                    CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060))),
       bVar9)) {
      StuntDouble::getJ(in_stack_fffffffffffff068);
      (*local_28->_vptr_StuntDouble[5])(&local_340);
      bVar9 = StuntDouble::isLinear(local_28);
      if (bVar9) {
        local_344 = StuntDouble::linearAxis(local_28);
        local_348 = local_344 + 1 + ((local_344 + 1) / 3) * -3;
        local_34c = local_344 + 2 + ((local_344 + 2) / 3) * -3;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,local_348);
        dVar11 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,local_348);
        dVar12 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_340,local_348,local_348);
        dVar1 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,local_34c);
        dVar2 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,local_34c);
        dVar3 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_340,local_34c,local_34c);
        local_f0 = (dVar11 * dVar12) / dVar1 + (dVar2 * dVar3) / *pdVar10 + local_f0;
      }
      else {
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,0);
        dVar11 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,0);
        dVar12 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_340,0,0);
        dVar1 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,1);
        dVar2 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,1);
        dVar3 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_340,1,1);
        dVar4 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,2);
        dVar13 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_2f8,2);
        dVar5 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_340,2,2);
        local_f0 = (dVar11 * dVar12) / dVar1 + (dVar2 * dVar3) / dVar4 + (dVar13 * dVar5) / *pdVar10
                   + local_f0;
      }
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3615fe);
    }
    local_28 = SelectionManager::nextSelected
                         (in_stack_fffffffffffff070,(int *)in_stack_fffffffffffff068);
  }
  local_28 = SelectionManager::beginSelected
                       (in_stack_fffffffffffff070,(int *)in_stack_fffffffffffff068);
  while (local_28 != (StuntDouble *)0x0) {
    StuntDouble::getPos(in_stack_fffffffffffff068);
    if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
      Snapshot::wrapVector(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    }
    local_370 = StuntDouble::getMass(local_28);
    StuntDouble::getVel(in_stack_fffffffffffff068);
    StuntDouble::getPos(in_stack_fffffffffffff068);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::Vector3
              ((Vector3<double> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
              ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
               in_stack_fffffffffffff070,(value_type *)in_stack_fffffffffffff068);
    OpenMD::operator*((double)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    RVar7 = local_370;
    local_128 = local_128 + local_370;
    dVar11 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3617da);
    local_178 = RVar7 * dVar11 + local_178;
    cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
    OpenMD::operator*((double)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    outProduct<double>((Vector3<double> *)in_stack_fffffffffffff088,
                       (Vector3<double> *)in_stack_fffffffffffff080);
    OpenMD::operator*(in_stack_fffffffffffff078,(double)in_stack_fffffffffffff070);
    RectMatrix<double,_3U,_3U>::operator-=
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               in_stack_fffffffffffff058);
    RectMatrix<double,_3U,_3U>::~RectMatrix(local_468);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3618e4);
    dVar12 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3618f1);
    RVar7 = local_370;
    local_3d8 = dVar12;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_170,0,0);
    RVar8 = local_370;
    dVar11 = local_3d8;
    *pdVar10 = RVar7 * dVar12 + *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_170,1,1);
    RVar7 = local_370;
    dVar12 = local_3d8;
    *pdVar10 = RVar8 * dVar11 + *pdVar10;
    pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_170,2,2);
    *pdVar10 = RVar7 * dVar12 + *pdVar10;
    if ((*(int *)(in_RDI + 0x244) == 2) &&
       (bVar9 = StuntDouble::isDirectional
                          ((StuntDouble *)
                           CONCAT17(in_stack_fffffffffffff067,
                                    CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060))),
       bVar9)) {
      StuntDouble::getJ(in_stack_fffffffffffff068);
      (*local_28->_vptr_StuntDouble[5])(&local_510);
      bVar9 = StuntDouble::isLinear(local_28);
      if (bVar9) {
        local_514 = StuntDouble::linearAxis(local_28);
        local_518 = local_514 + 1 + ((local_514 + 1) / 3) * -3;
        local_51c = local_514 + 2 + ((local_514 + 2) / 3) * -3;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,local_518);
        dVar11 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,local_518);
        dVar12 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_510,local_518,local_518);
        dVar1 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,local_51c);
        dVar2 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,local_51c);
        dVar3 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_510,local_51c,local_51c);
        local_178 = (dVar11 * dVar12) / dVar1 + (dVar2 * dVar3) / *pdVar10 + local_178;
      }
      else {
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,0);
        dVar11 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,0);
        dVar12 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_510,0,0);
        dVar1 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,1);
        dVar2 = *pdVar10;
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,1);
        dVar3 = *pdVar10;
        pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_510,1,1);
        dVar4 = *pdVar10;
        in_stack_fffffffffffff0f8 =
             (SquareMatrix3<double> *)Vector<double,_3U>::operator[](local_4c8,2);
        in_stack_fffffffffffff0e0 =
             (Snapshot *)
             (in_stack_fffffffffffff0f8->super_SquareMatrix<double,_3>).
             super_RectMatrix<double,_3U,_3U>.data_[0][0];
        pdVar10 = Vector<double,_3U>::operator[](local_4c8,2);
        dVar13 = (double)in_stack_fffffffffffff0e0 * *pdVar10;
        in_stack_fffffffffffff0d8 =
             (Vector3d *)RectMatrix<double,_3U,_3U>::operator()(&local_510,2,2);
        local_178 = (dVar11 * dVar12) / dVar1 + (dVar2 * dVar3) / dVar4 +
                    dVar13 / (in_stack_fffffffffffff0d8->super_Vector<double,_3U>).data_[0] +
                    local_178;
      }
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x361f91);
    }
    in_stack_fffffffffffff0c8 =
         SelectionManager::nextSelected(in_stack_fffffffffffff070,(int *)in_stack_fffffffffffff068);
    local_28 = in_stack_fffffffffffff0c8;
  }
  local_f0 = local_f0 * 0.5;
  local_178 = local_178 * 0.5;
  Vector3<double>::Vector3((Vector3<double> *)0x362004);
  Vector3<double>::Vector3((Vector3<double> *)0x362013);
  Vector3<double>::Vector3((Vector3<double> *)0x362022);
  Vector3<double>::Vector3((Vector3<double> *)0x362031);
  Vector3<double>::Vector3((Vector3<double> *)0x362040);
  Vector3<double>::Vector3((Vector3<double> *)0x36204f);
  Vector3<double>::Vector3((Vector3<double> *)0x36205e);
  Vector3<double>::Vector3((Vector3<double> *)0x36206d);
  local_5e1 = 0;
  if ((0.0 < local_a0) && (0.0 < local_128)) {
    operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
              (double)CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::Vector3
              ((Vector3<double> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
              (double)CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff068,
               (Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
              (double)CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff068,
               (Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    SquareMatrix3<double>::inverse(in_stack_fffffffffffff0f8);
    OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
    Vector3<double>::Vector3
              ((Vector3<double> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
               (Vector<double,_3U> *)in_stack_fffffffffffff058);
    OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068);
    OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff068,
               (Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                      (Vector<double,_3U> *)
                      CONCAT17(in_stack_fffffffffffff067,
                               CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff068,
               (Vector<double,_3U> *)
               CONCAT17(in_stack_fffffffffffff067,
                        CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
    local_770 = local_178 - *(double *)(in_RDI + 0x2a8);
    if ((local_179 & 1U) != 0) {
      dVar11 = local_128 * 0.5;
      in_stack_fffffffffffff0c0 =
           (Vector3<double> *)Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3622f1);
      local_770 = -dVar11 * (double)in_stack_fffffffffffff0c0 + local_770;
    }
    if ((local_17a & 1U) != 0) {
      OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
      dVar11 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff070,
                              (Vector<double,_3U> *)in_stack_fffffffffffff068);
      local_770 = dVar11 * -0.5 + local_770;
    }
    local_790 = local_178;
    if ((local_179 & 1U) != 0) {
      dVar11 = local_128 * 0.5;
      dVar12 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x362403);
      local_790 = -dVar11 * dVar12 + local_790;
    }
    if ((local_17a & 1U) != 0) {
      OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
      dVar11 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff070,
                              (Vector<double,_3U> *)in_stack_fffffffffffff068);
      local_790 = dVar11 * -0.5 + local_790;
    }
    if (((0.0 < local_770 / local_790) && (local_7b0 = sqrt(local_770 / local_790), 0.9 < local_7b0)
        ) && (local_7b0 < 1.1)) {
      operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
                (double)CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      Vector3<double>::Vector3
                ((Vector3<double> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                 (Vector<double,_3U> *)in_stack_fffffffffffff058);
      operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
                (double)CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                        (Vector<double,_3U> *)
                        CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff068,
                 (Vector<double,_3U> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      operator/((Vector<double,_3U> *)in_stack_fffffffffffff068,
                (double)CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff068,
                 (Vector<double,_3U> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      SquareMatrix3<double>::inverse(in_stack_fffffffffffff0f8);
      OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
      Vector3<double>::Vector3
                ((Vector3<double> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                 (Vector<double,_3U> *)in_stack_fffffffffffff058);
      OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
      OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                        (Vector<double,_3U> *)
                        CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff068,
                 (Vector<double,_3U> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                        (Vector<double,_3U> *)
                        CONCAT17(in_stack_fffffffffffff067,
                                 CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff068,
                 (Vector<double,_3U> *)
                 CONCAT17(in_stack_fffffffffffff067,
                          CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
      local_8f0 = local_f0 + *(double *)(in_RDI + 0x2a8);
      if ((local_179 & 1U) != 0) {
        in_stack_fffffffffffff088 = (RectMatrix<double,_3U,_3U> *)(local_a0 * 0.5);
        dVar11 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x362730);
        local_8f0 = -(double)in_stack_fffffffffffff088 * dVar11 + local_8f0;
      }
      if ((local_17a & 1U) != 0) {
        OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
        in_stack_fffffffffffff080 =
             (Vector<double,_3U> *)
             dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff070,
                            (Vector<double,_3U> *)in_stack_fffffffffffff068);
        local_8f0 = (double)in_stack_fffffffffffff080 * -0.5 + local_8f0;
      }
      local_910 = local_f0;
      if ((local_179 & 1U) != 0) {
        in_stack_fffffffffffff070 = (SelectionManager *)(local_a0 * 0.5);
        dVar11 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x36284f);
        local_910 = -(double)in_stack_fffffffffffff070 * dVar11 + local_910;
      }
      if ((local_17a & 1U) != 0) {
        OpenMD::operator*(in_stack_fffffffffffff088,in_stack_fffffffffffff080);
        in_stack_fffffffffffff068 =
             (StuntDouble *)
             dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff070,
                            (Vector<double,_3U> *)in_stack_fffffffffffff068);
        local_910 = (double)in_stack_fffffffffffff068 * -0.5 + local_910;
      }
      if (((0.0 < local_8f0 / local_910) &&
          (local_930 = sqrt(local_8f0 / local_910), 0.9 < local_930)) && (local_930 < 1.1)) {
        __gnu_cxx::
        __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
        ::__normal_iterator(&local_938);
        Vector3<double>::Vector3((Vector3<double> *)0x36298d);
        Vector3<double>::Vector3((Vector3<double> *)0x36299c);
        local_938._M_current =
             (StuntDouble **)
             std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::begin
                       ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                        in_stack_fffffffffffff058);
        while( true ) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::end
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     in_stack_fffffffffffff058);
          bVar9 = __gnu_cxx::operator!=
                            ((__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                              *)CONCAT17(in_stack_fffffffffffff067,
                                         CONCAT16(in_stack_fffffffffffff066,
                                                  in_stack_fffffffffffff060)),
                             (__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                              *)in_stack_fffffffffffff058);
          if (!bVar9) break;
          if ((local_179 & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getVel(in_stack_fffffffffffff068);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (double)CONCAT17(in_stack_fffffffffffff067,
                                               CONCAT16(in_stack_fffffffffffff066,
                                                        in_stack_fffffffffffff060)));
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
          }
          if ((local_17a & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getPos(in_stack_fffffffffffff068);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getVel(in_stack_fffffffffffff068);
            cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (double)CONCAT17(in_stack_fffffffffffff067,
                                               CONCAT16(in_stack_fffffffffffff066,
                                                        in_stack_fffffffffffff060)));
            cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
          }
          __gnu_cxx::
          __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
          ::operator*(&local_938);
          StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffff070,
                              (Vector3d *)in_stack_fffffffffffff068);
          if (*(int *)(in_RDI + 0x244) == 2) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            in_stack_fffffffffffff067 =
                 StuntDouble::isDirectional
                           ((StuntDouble *)
                            CONCAT17(in_stack_fffffffffffff067,
                                     CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)))
            ;
            if ((bool)in_stack_fffffffffffff067) {
              __gnu_cxx::
              __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              ::operator*(&local_938);
              StuntDouble::getJ(in_stack_fffffffffffff068);
              OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                                (double)CONCAT17(in_stack_fffffffffffff067,
                                                 CONCAT16(in_stack_fffffffffffff066,
                                                          in_stack_fffffffffffff060)));
              Vector3<double>::Vector3
                        ((Vector3<double> *)
                         CONCAT17(in_stack_fffffffffffff067,
                                  CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                         (Vector<double,_3U> *)in_stack_fffffffffffff058);
              __gnu_cxx::
              __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              ::operator*(&local_938);
              StuntDouble::setJ((StuntDouble *)in_stack_fffffffffffff070,
                                (Vector3d *)in_stack_fffffffffffff068);
            }
          }
          __gnu_cxx::
          __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
          ::operator++(&local_938);
        }
        local_938._M_current =
             (StuntDouble **)
             std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::begin
                       ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                        in_stack_fffffffffffff058);
        while( true ) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::end
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     in_stack_fffffffffffff058);
          bVar9 = __gnu_cxx::operator!=
                            ((__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                              *)CONCAT17(in_stack_fffffffffffff067,
                                         CONCAT16(in_stack_fffffffffffff066,
                                                  in_stack_fffffffffffff060)),
                             (__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                              *)in_stack_fffffffffffff058);
          if (!bVar9) break;
          if ((local_179 & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getVel(in_stack_fffffffffffff068);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (double)CONCAT17(in_stack_fffffffffffff067,
                                               CONCAT16(in_stack_fffffffffffff066,
                                                        in_stack_fffffffffffff060)));
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
          }
          if ((local_17a & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getPos(in_stack_fffffffffffff068);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            StuntDouble::getVel(in_stack_fffffffffffff068);
            cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (double)CONCAT17(in_stack_fffffffffffff067,
                                               CONCAT16(in_stack_fffffffffffff066,
                                                        in_stack_fffffffffffff060)));
            cross<double>((Vector3<double> *)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff068,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff067,
                                       CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)
                                      ));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff068,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff067,
                                CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)));
          }
          __gnu_cxx::
          __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
          ::operator*(&local_938);
          StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffff070,
                              (Vector3d *)in_stack_fffffffffffff068);
          if (*(int *)(in_RDI + 0x244) == 2) {
            __gnu_cxx::
            __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
            ::operator*(&local_938);
            in_stack_fffffffffffff066 =
                 StuntDouble::isDirectional
                           ((StuntDouble *)
                            CONCAT17(in_stack_fffffffffffff067,
                                     CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)))
            ;
            if ((bool)in_stack_fffffffffffff066) {
              __gnu_cxx::
              __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              ::operator*(&local_938);
              StuntDouble::getJ(in_stack_fffffffffffff068);
              OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff068,
                                (double)CONCAT17(in_stack_fffffffffffff067,
                                                 CONCAT16(in_stack_fffffffffffff066,
                                                          in_stack_fffffffffffff060)));
              Vector3<double>::Vector3
                        ((Vector3<double> *)
                         CONCAT17(in_stack_fffffffffffff067,
                                  CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                         (Vector<double,_3U> *)in_stack_fffffffffffff058);
              __gnu_cxx::
              __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
              ::operator*(&local_938);
              StuntDouble::setJ((StuntDouble *)in_stack_fffffffffffff070,
                                (Vector3d *)in_stack_fffffffffffff068);
            }
          }
          __gnu_cxx::
          __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
          ::operator++(&local_938);
        }
        local_5e1 = 1;
        *(double *)(in_RDI + 0x2e8) = *(double *)(in_RDI + 0x2e8) + *(double *)(in_RDI + 0x2a8);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)
                   CONCAT17(in_stack_fffffffffffff067,
                            CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                   (Vector<double,_3U> *)in_stack_fffffffffffff058);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)
                   CONCAT17(in_stack_fffffffffffff067,
                            CONCAT16(in_stack_fffffffffffff066,in_stack_fffffffffffff060)),
                   (Vector<double,_3U> *)in_stack_fffffffffffff058);
      }
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x363053);
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x363062);
  }
  if ((local_5e1 & 1) != 1) {
    peVar14 = &painCave;
    snprintf(painCave.errMsg,2000,
             "VSS exchange NOT performed - roots that solve\n\tthe constraint equations may not exist or there may be\n\tno selected objects in one or both slabs.\n"
            );
    peVar14->isFatal = 0;
    peVar14->severity = 3;
    simError();
    *(int *)(in_RDI + 0x32c) = *(int *)(in_RDI + 0x32c) + 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3630e8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3630f5);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffff070);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffff070);
  return;
}

Assistant:

void VSSMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    vector<StuntDouble*> hotBin, coldBin;

    Vector3d Ph(V3Zero);
    Vector3d Lh(V3Zero);
    RealType Mh = 0.0;
    Mat3x3d Ih(0.0);
    RealType Kh = 0.0;
    Vector3d Pc(V3Zero);
    Vector3d Lc(V3Zero);
    RealType Mc = 0.0;
    Mat3x3d Ic(0.0);
    RealType Kc = 0.0;

    // Constraints can be on only the linear or angular momentum, but
    // not both.  Usually, the user will specify which they want, but
    // in case they don't, the use of periodic boundaries should make
    // the choice for us.
    bool doLinearPart  = false;
    bool doAngularPart = false;

    switch (rnemdFluxType_) {
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
    case rnemdPvector:
    case rnemdKePx:
    case rnemdKePy:
    case rnemdKePvector:
      doLinearPart = true;
      break;
    case rnemdLx:
    case rnemdLy:
    case rnemdLz:
    case rnemdLvector:
    case rnemdKeLx:
    case rnemdKeLy:
    case rnemdKeLz:
    case rnemdKeLvector:
      doAngularPart = true;
      break;
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
    default:
      if (usePeriodicBoundaryConditions_)
        doLinearPart = true;
      else
        doAngularPart = true;
      break;
    }

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      hotBin.push_back(sd);
      Ph += mass * vel;
      Mh += mass;
      Kh += mass * vel.lengthSquare();
      Lh += mass * cross(rPos, vel);
      Ih -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ih(0, 0) += mass * r2;
      Ih(1, 1) += mass * r2;
      Ih(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kh += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kh += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      coldBin.push_back(sd);
      Pc += mass * vel;
      Mc += mass;
      Kc += mass * vel.lengthSquare();
      Lc += mass * cross(rPos, vel);
      Ic -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ic(0, 0) += mass * r2;
      Ic(1, 1) += mass * r2;
      Ic(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kc += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kc += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    Kh *= 0.5;
    Kc *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Ph[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Pc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lh[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ih.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ic.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    Vector3d ac, acrec, bc, bcrec;
    Vector3d ah, ahrec, bh, bhrec;

    bool successfulExchange = false;
    if ((Mh > 0.0) && (Mc > 0.0)) {  // both slabs are not empty

      Vector3d vc = Pc / Mc;
      ac          = -momentumTarget_ / Mc + vc;
      acrec       = -momentumTarget_ / Mc;

      // We now need the inverse of the inertia tensor to calculate the
      // angular velocity of the cold slab;
      Mat3x3d Ici     = Ic.inverse();
      Vector3d omegac = Ici * Lc;
      bc              = -(Ici * angularMomentumTarget_) + omegac;
      bcrec           = bc - omegac;

      RealType cNumerator = Kc - kineticTarget_;
      if (doLinearPart) cNumerator -= 0.5 * Mc * ac.lengthSquare();

      if (doAngularPart) cNumerator -= 0.5 * (dot(bc, Ic * bc));

      RealType cDenominator = Kc;

      if (doLinearPart) cDenominator -= 0.5 * Mc * vc.lengthSquare();

      if (doAngularPart) cDenominator -= 0.5 * (dot(omegac, Ic * omegac));

      if (cNumerator / cDenominator > 0.0) {
        RealType c = sqrt(cNumerator / cDenominator);

        if ((c > 0.9) && (c < 1.1)) {  // restrict scaling coefficients

          Vector3d vh = Ph / Mh;
          ah          = momentumTarget_ / Mh + vh;
          ahrec       = momentumTarget_ / Mh;

          // We now need the inverse of the inertia tensor to
          // calculate the angular velocity of the hot slab;
          Mat3x3d Ihi     = Ih.inverse();
          Vector3d omegah = Ihi * Lh;
          bh              = (Ihi * angularMomentumTarget_) + omegah;
          bhrec           = bh - omegah;

          RealType hNumerator = Kh + kineticTarget_;
          if (doLinearPart) hNumerator -= 0.5 * Mh * ah.lengthSquare();

          if (doAngularPart) hNumerator -= 0.5 * (dot(bh, Ih * bh));

          RealType hDenominator = Kh;
          if (doLinearPart) hDenominator -= 0.5 * Mh * vh.lengthSquare();
          if (doAngularPart) hDenominator -= 0.5 * (dot(omegah, Ih * omegah));

          if (hNumerator / hDenominator > 0.0) {
            RealType h = sqrt(hNumerator / hDenominator);

            if ((h > 0.9) && (h < 1.1)) {
              vector<StuntDouble*>::iterator sdi;
              Vector3d vel;
              Vector3d rPos;

              for (sdi = coldBin.begin(); sdi != coldBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vc) * c + ac;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegac, rPos)) * c +
                        cross(bc, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * c;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              for (sdi = hotBin.begin(); sdi != hotBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vh) * h + ah;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegah, rPos)) * h +
                        cross(bh, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * h;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              successfulExchange = true;
              kineticExchange_ += kineticTarget_;
              momentumExchange_ += momentumTarget_;
              angularMomentumExchange_ += angularMomentumTarget_;
            }
          }
        }
      }
    }

    if (successfulExchange != true) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "VSS exchange NOT performed - roots that solve\n"
               "\tthe constraint equations may not exist or there may be\n"
               "\tno selected objects in one or both slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }